

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

uchar * write_bn(uchar *buf,BIGNUM *bn,int bn_bytes)

{
  buf[4] = '\0';
  BN_bn2bin((BIGNUM *)bn,buf + 5);
  if (-1 < (char)buf[5]) {
    bn_bytes = bn_bytes - 1;
    memmove(buf + 4,buf + 5,(long)bn_bytes);
  }
  _libssh2_htonu32(buf,bn_bytes);
  return buf + 4 + bn_bytes;
}

Assistant:

static unsigned char *
write_bn(unsigned char *buf, const BIGNUM *bn, int bn_bytes)
{
    unsigned char *p = buf;

    /* Left space for bn size which will be written below. */
    p += 4;

    *p = 0;
    BN_bn2bin(bn, p + 1);
    if (!(*(p + 1) & 0x80)) {
        memmove(p, p + 1, --bn_bytes);
    }
    _libssh2_htonu32(p - 4, bn_bytes);  /* Post write bn size. */

    return p + bn_bytes;
}